

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_xmlstring(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  int *piVar10;
  ulong uVar11;
  char *__s;
  int *in_RSI;
  int *piVar12;
  uint uVar13;
  bool bVar14;
  int n_cur;
  uint uVar15;
  int local_94;
  int test_ret;
  int local_8c;
  int local_88;
  int test_ret_2;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int test_ret_5;
  int test_ret_4;
  int local_68;
  int test_ret_3;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int test_ret_1;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing xmlstring : 26 of 30 functions ...");
  }
  test_ret = 0;
  for (uVar15 = 0; uVar15 != 4; uVar15 = uVar15 + 1) {
    iVar1 = xmlMemBlocks();
    lVar6 = xmlCharStrdup();
    if (lVar6 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCharStrdup",(ulong)(uint)(iVar2 - iVar1));
      test_ret = test_ret + 1;
      in_RSI = (int *)(ulong)uVar15;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_94 = 0;
  uVar11 = 0;
  while (iVar1 = (int)uVar11, iVar1 != 4) {
    piVar12 = (int *)0x0;
    while (iVar2 = (int)piVar12, iVar2 != 4) {
      iVar3 = xmlMemBlocks();
      if (iVar1 == 0) {
        bVar14 = false;
        __s = "foo";
      }
      else if (iVar1 == 2) {
        bVar14 = false;
        __s = "test/ent2";
      }
      else if (iVar1 == 1) {
        bVar14 = false;
        __s = "<foo/>";
      }
      else {
        bVar14 = true;
        __s = (char *)0x0;
      }
      uVar15 = gen_int(iVar2,(int)in_RSI);
      if ((bVar14) || (sVar7 = strlen(__s), (int)uVar15 <= (int)sVar7 + 1)) {
        in_RSI = (int *)(ulong)uVar15;
        lVar6 = xmlCharStrndup();
        if (lVar6 != 0) {
          (*_xmlFree)();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCharStrndup",(ulong)(uint)(iVar4 - iVar3));
          local_94 = local_94 + 1;
          printf(" %d",uVar11);
          printf(" %d");
          putchar(10);
          in_RSI = piVar12;
        }
      }
      piVar12 = (int *)(ulong)(iVar2 + 1);
    }
    uVar11 = (ulong)(iVar1 + 1);
  }
  function_tests = function_tests + 1;
  test_ret = -(test_ret + local_94);
  bVar14 = true;
  while (bVar14) {
    iVar1 = xmlMemBlocks();
    xmlCheckUTF8(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar14 = false;
    printf("Leak of %d blocks found in xmlCheckUTF8");
    in_RSI = (int *)0x0;
    printf(" %d");
    putchar(10);
    test_ret = test_ret + -1;
  }
  function_tests = function_tests + 1;
  bVar14 = true;
  local_4c = 0;
  while (bVar14) {
    piVar12 = (int *)0x0;
    while (iVar1 = (int)piVar12, iVar1 != 2) {
      iVar2 = xmlMemBlocks();
      in_RSI = (int *)0x0;
      if (iVar1 == 0) {
        in_RSI = inttab + 1;
      }
      xmlGetUTF8Char(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetUTF8Char",(ulong)(uint)(iVar3 - iVar2));
        local_4c = local_4c + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = piVar12;
      }
      piVar12 = (int *)(ulong)(iVar1 + 1);
    }
    bVar14 = false;
  }
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    piVar12 = (int *)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)piVar12;
      if (iVar2 == 5) break;
      iVar3 = xmlMemBlocks();
      pxVar8 = gen_const_xmlChar_ptr(uVar15,iVar1);
      in_RSI = (int *)gen_const_xmlChar_ptr(iVar2,iVar1);
      xmlStrEqual(pxVar8);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar3 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrEqual",(ulong)(uint)(iVar1 - iVar3));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
        in_RSI = piVar12;
      }
      piVar12 = (int *)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_34 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    uVar11 = 0;
    while (iVar1 = (int)uVar11, iVar1 != 5) {
      piVar12 = (int *)0x0;
      while( true ) {
        iVar2 = (int)in_RSI;
        iVar3 = (int)piVar12;
        if (iVar3 == 5) break;
        iVar4 = xmlMemBlocks();
        pxVar8 = gen_const_xmlChar_ptr(uVar15,iVar2);
        in_RSI = (int *)gen_const_xmlChar_ptr(iVar1,iVar2);
        pxVar9 = gen_const_xmlChar_ptr(iVar3,iVar2);
        xmlStrQEqual(pxVar8,in_RSI,pxVar9);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar4 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStrQEqual",(ulong)(uint)(iVar2 - iVar4));
          local_34 = local_34 + 1;
          printf(" %d",(ulong)uVar15);
          printf(" %d",uVar11);
          printf(" %d");
          putchar(10);
          in_RSI = piVar12;
        }
        piVar12 = (int *)(ulong)(iVar3 + 1);
      }
      uVar11 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_54 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    piVar12 = (int *)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)piVar12;
      if (iVar2 == 5) break;
      iVar3 = xmlMemBlocks();
      pxVar8 = gen_const_xmlChar_ptr(uVar15,iVar1);
      in_RSI = (int *)gen_const_xmlChar_ptr(iVar2,iVar1);
      xmlStrcasecmp(pxVar8);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar3 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrcasecmp",(ulong)(uint)(iVar1 - iVar3));
        local_54 = local_54 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
        in_RSI = piVar12;
      }
      piVar12 = (int *)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_58 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    piVar12 = (int *)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)piVar12;
      if (iVar2 == 5) break;
      iVar3 = xmlMemBlocks();
      pxVar8 = gen_const_xmlChar_ptr(uVar15,iVar1);
      in_RSI = (int *)gen_const_xmlChar_ptr(iVar2,iVar1);
      xmlStrcasestr(pxVar8);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar3 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrcasestr",(ulong)(uint)(iVar1 - iVar3));
        local_58 = local_58 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
        in_RSI = piVar12;
      }
      piVar12 = (int *)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_5c = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    piVar12 = (int *)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      uVar13 = (uint)piVar12;
      if (uVar13 == 4) break;
      iVar2 = xmlMemBlocks();
      pxVar8 = gen_const_xmlChar_ptr(uVar15,iVar1);
      uVar11 = (ulong)(0xf82061 >> ((char)piVar12 * '\b' & 0x1fU));
      if (2 < uVar13) {
        uVar11 = 0;
      }
      in_RSI = (int *)(uVar11 & 0xff);
      xmlStrchr(pxVar8);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar2 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrchr",(ulong)(uint)(iVar1 - iVar2));
        local_5c = local_5c + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
        in_RSI = piVar12;
      }
      piVar12 = (int *)(ulong)(uVar13 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_60 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    piVar12 = (int *)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)piVar12;
      if (iVar2 == 5) break;
      iVar3 = xmlMemBlocks();
      pxVar8 = gen_const_xmlChar_ptr(uVar15,iVar1);
      in_RSI = (int *)gen_const_xmlChar_ptr(iVar2,iVar1);
      xmlStrcmp(pxVar8);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar3 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrcmp",(ulong)(uint)(iVar1 - iVar3));
        local_60 = local_60 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
        in_RSI = piVar12;
      }
      piVar12 = (int *)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_80 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    iVar1 = xmlMemBlocks();
    pxVar8 = gen_const_xmlChar_ptr(uVar15,(int)in_RSI);
    lVar6 = xmlStrdup(pxVar8);
    if (lVar6 != 0) {
      (*_xmlFree)(lVar6);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlStrdup",(ulong)(uint)(iVar2 - iVar1));
      local_80 = local_80 + 1;
      in_RSI = (int *)(ulong)uVar15;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    iVar1 = xmlMemBlocks();
    pxVar8 = gen_const_xmlChar_ptr(uVar15,(int)in_RSI);
    xmlStrlen(pxVar8);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlStrlen",(ulong)(uint)(iVar2 - iVar1));
      test_ret_2 = test_ret_2 + 1;
      in_RSI = (int *)(ulong)uVar15;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_38 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    for (uVar13 = 0; uVar13 != 5; uVar13 = uVar13 + 1) {
      piVar12 = (int *)0x0;
      while (iVar1 = (int)piVar12, iVar1 != 4) {
        iVar2 = xmlMemBlocks();
        pxVar8 = gen_const_xmlChar_ptr(uVar15,(int)in_RSI);
        piVar10 = (int *)gen_const_xmlChar_ptr(uVar13,(int)in_RSI);
        iVar3 = gen_int(iVar1,(int)in_RSI);
        if ((piVar10 == (int *)0x0) || (sVar7 = strlen((char *)piVar10), iVar3 <= (int)sVar7 + 1)) {
          xmlStrncasecmp(pxVar8,piVar10,iVar3);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          in_RSI = piVar10;
          if (iVar2 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStrncasecmp",(ulong)(uint)(iVar3 - iVar2));
            local_38 = local_38 + 1;
            printf(" %d",(ulong)uVar15);
            printf(" %d",(ulong)uVar13);
            printf(" %d");
            putchar(10);
            in_RSI = piVar12;
          }
        }
        piVar12 = (int *)(ulong)(iVar1 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  local_3c = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    uVar11 = 0;
    while (iVar1 = (int)uVar11, iVar1 != 5) {
      piVar12 = (int *)0x0;
      while (iVar2 = (int)piVar12, iVar2 != 4) {
        iVar3 = xmlMemBlocks();
        pxVar8 = gen_const_xmlChar_ptr(uVar15,(int)in_RSI);
        piVar10 = (int *)gen_const_xmlChar_ptr(iVar1,(int)in_RSI);
        iVar4 = gen_int(iVar2,(int)in_RSI);
        if ((piVar10 == (int *)0x0) || (sVar7 = strlen((char *)piVar10), iVar4 <= (int)sVar7 + 1)) {
          lVar6 = xmlStrncatNew(pxVar8,piVar10,iVar4);
          if (lVar6 != 0) {
            (*_xmlFree)(lVar6);
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          in_RSI = piVar10;
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStrncatNew",(ulong)(uint)(iVar4 - iVar3));
            local_3c = local_3c + 1;
            printf(" %d",(ulong)uVar15);
            printf(" %d",uVar11);
            printf(" %d");
            putchar(10);
            in_RSI = piVar12;
          }
        }
        piVar12 = (int *)(ulong)(iVar2 + 1);
      }
      uVar11 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_40 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    for (uVar13 = 0; uVar13 != 5; uVar13 = uVar13 + 1) {
      piVar12 = (int *)0x0;
      while (iVar1 = (int)piVar12, iVar1 != 4) {
        iVar2 = xmlMemBlocks();
        pxVar8 = gen_const_xmlChar_ptr(uVar15,(int)in_RSI);
        piVar10 = (int *)gen_const_xmlChar_ptr(uVar13,(int)in_RSI);
        iVar3 = gen_int(iVar1,(int)in_RSI);
        if ((piVar10 == (int *)0x0) || (sVar7 = strlen((char *)piVar10), iVar3 <= (int)sVar7 + 1)) {
          xmlStrncmp(pxVar8,piVar10,iVar3);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          in_RSI = piVar10;
          if (iVar2 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStrncmp",(ulong)(uint)(iVar3 - iVar2));
            local_40 = local_40 + 1;
            printf(" %d",(ulong)uVar15);
            printf(" %d",(ulong)uVar13);
            printf(" %d");
            putchar(10);
            in_RSI = piVar12;
          }
        }
        piVar12 = (int *)(ulong)(iVar1 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  local_74 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    piVar12 = (int *)0x0;
    while (iVar1 = (int)piVar12, iVar1 != 4) {
      iVar2 = xmlMemBlocks();
      pxVar8 = gen_const_xmlChar_ptr(uVar15,(int)in_RSI);
      uVar13 = gen_int(iVar1,(int)in_RSI);
      if ((pxVar8 == (xmlChar *)0x0) ||
         (sVar7 = strlen((char *)pxVar8), (int)uVar13 <= (int)sVar7 + 1)) {
        in_RSI = (int *)(ulong)uVar13;
        lVar6 = xmlStrndup(pxVar8);
        if (lVar6 != 0) {
          (*_xmlFree)(lVar6);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStrndup",(ulong)(uint)(iVar3 - iVar2));
          local_74 = local_74 + 1;
          printf(" %d",(ulong)uVar15);
          printf(" %d");
          putchar(10);
          in_RSI = piVar12;
        }
      }
      piVar12 = (int *)(ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_3 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    piVar12 = (int *)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)piVar12;
      if (iVar2 == 5) break;
      iVar3 = xmlMemBlocks();
      pxVar8 = gen_const_xmlChar_ptr(uVar15,iVar1);
      in_RSI = (int *)gen_const_xmlChar_ptr(iVar2,iVar1);
      xmlStrstr(pxVar8);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar3 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrstr",(ulong)(uint)(iVar1 - iVar3));
        test_ret_3 = test_ret_3 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
        in_RSI = piVar12;
      }
      piVar12 = (int *)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_44 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    uVar11 = 0;
    while (iVar1 = (int)uVar11, iVar1 != 4) {
      piVar12 = (int *)0x0;
      while (iVar2 = (int)piVar12, iVar2 != 4) {
        iVar3 = xmlMemBlocks();
        pxVar8 = gen_const_xmlChar_ptr(uVar15,(int)in_RSI);
        uVar13 = gen_int(iVar1,(int)in_RSI);
        iVar4 = gen_int(iVar2,(int)in_RSI);
        if ((pxVar8 == (xmlChar *)0x0) ||
           (sVar7 = strlen((char *)pxVar8), iVar5 = (int)sVar7 + 1,
           iVar4 <= iVar5 && (int)uVar13 <= iVar5)) {
          in_RSI = (int *)(ulong)uVar13;
          lVar6 = xmlStrsub(pxVar8,in_RSI,iVar4);
          if (lVar6 != 0) {
            (*_xmlFree)(lVar6);
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStrsub",(ulong)(uint)(iVar4 - iVar3));
            local_44 = local_44 + 1;
            printf(" %d",(ulong)uVar15);
            printf(" %d",uVar11);
            printf(" %d");
            putchar(10);
            in_RSI = piVar12;
          }
        }
        piVar12 = (int *)(ulong)(iVar2 + 1);
      }
      uVar11 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_68 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    piVar12 = (int *)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)piVar12;
      if (iVar2 == 5) break;
      iVar3 = xmlMemBlocks();
      pxVar8 = gen_const_xmlChar_ptr(uVar15,iVar1);
      in_RSI = (int *)gen_const_xmlChar_ptr(iVar2,iVar1);
      xmlUTF8Charcmp(pxVar8);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar3 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUTF8Charcmp",(ulong)(uint)(iVar1 - iVar3));
        local_68 = local_68 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
        in_RSI = piVar12;
      }
      piVar12 = (int *)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_88 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    iVar1 = xmlMemBlocks();
    pxVar8 = gen_const_xmlChar_ptr(uVar15,(int)in_RSI);
    xmlUTF8Size(pxVar8);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlUTF8Size",(ulong)(uint)(iVar2 - iVar1));
      local_88 = local_88 + 1;
      in_RSI = (int *)(ulong)uVar15;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_8c = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    iVar1 = xmlMemBlocks();
    pxVar8 = gen_const_xmlChar_ptr(uVar15,(int)in_RSI);
    xmlUTF8Strlen(pxVar8);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlUTF8Strlen",(ulong)(uint)(iVar2 - iVar1));
      local_8c = local_8c + 1;
      in_RSI = (int *)(ulong)uVar15;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    piVar12 = (int *)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)piVar12;
      if (iVar2 == 5) break;
      iVar3 = xmlMemBlocks();
      pxVar8 = gen_const_xmlChar_ptr(uVar15,iVar1);
      in_RSI = (int *)gen_const_xmlChar_ptr(iVar2,iVar1);
      xmlUTF8Strloc(pxVar8);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar3 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUTF8Strloc",(ulong)(uint)(iVar1 - iVar3));
        test_ret_4 = test_ret_4 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
        in_RSI = piVar12;
      }
      piVar12 = (int *)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_78 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    piVar12 = (int *)0x0;
    while (iVar1 = (int)piVar12, iVar1 != 4) {
      iVar2 = xmlMemBlocks();
      pxVar8 = gen_const_xmlChar_ptr(uVar15,(int)in_RSI);
      uVar13 = gen_int(iVar1,(int)in_RSI);
      if ((pxVar8 == (xmlChar *)0x0) ||
         (sVar7 = strlen((char *)pxVar8), (int)uVar13 <= (int)sVar7 + 1)) {
        in_RSI = (int *)(ulong)uVar13;
        lVar6 = xmlUTF8Strndup(pxVar8);
        if (lVar6 != 0) {
          (*_xmlFree)(lVar6);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlUTF8Strndup",(ulong)(uint)(iVar3 - iVar2));
          local_78 = local_78 + 1;
          printf(" %d",(ulong)uVar15);
          printf(" %d");
          putchar(10);
          in_RSI = piVar12;
        }
      }
      piVar12 = (int *)(ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_5 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    piVar12 = (int *)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)piVar12;
      if (iVar2 == 4) break;
      iVar3 = xmlMemBlocks();
      pxVar8 = gen_const_xmlChar_ptr(uVar15,iVar1);
      uVar13 = gen_int(iVar2,iVar1);
      in_RSI = (int *)(ulong)uVar13;
      xmlUTF8Strpos(pxVar8);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar3 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUTF8Strpos",(ulong)(uint)(iVar1 - iVar3));
        test_ret_5 = test_ret_5 + 1;
        printf(" %d",(ulong)uVar15);
        printf(" %d");
        putchar(10);
        in_RSI = piVar12;
      }
      piVar12 = (int *)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_7c = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    piVar12 = (int *)0x0;
    while (iVar1 = (int)piVar12, iVar1 != 4) {
      iVar2 = xmlMemBlocks();
      pxVar8 = gen_const_xmlChar_ptr(uVar15,(int)in_RSI);
      uVar13 = gen_int(iVar1,(int)in_RSI);
      piVar10 = (int *)(ulong)uVar13;
      if ((pxVar8 == (xmlChar *)0x0) ||
         (sVar7 = strlen((char *)pxVar8), (int)uVar13 <= (int)sVar7 + 1)) {
        xmlUTF8Strsize(pxVar8);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        in_RSI = piVar10;
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlUTF8Strsize",(ulong)(uint)(iVar3 - iVar2));
          local_7c = local_7c + 1;
          printf(" %d",(ulong)uVar15);
          printf(" %d");
          putchar(10);
          in_RSI = piVar12;
        }
      }
      piVar12 = (int *)(ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_48 = 0;
  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
    uVar11 = 0;
    while (iVar1 = (int)uVar11, iVar1 != 4) {
      piVar12 = (int *)0x0;
      while (iVar2 = (int)piVar12, iVar2 != 4) {
        iVar3 = xmlMemBlocks();
        pxVar8 = gen_const_xmlChar_ptr(uVar15,(int)in_RSI);
        uVar13 = gen_int(iVar1,(int)in_RSI);
        iVar4 = gen_int(iVar2,(int)in_RSI);
        if ((pxVar8 == (xmlChar *)0x0) ||
           (sVar7 = strlen((char *)pxVar8), iVar5 = (int)sVar7 + 1,
           iVar4 <= iVar5 && (int)uVar13 <= iVar5)) {
          in_RSI = (int *)(ulong)uVar13;
          lVar6 = xmlUTF8Strsub(pxVar8,in_RSI,iVar4);
          if (lVar6 != 0) {
            (*_xmlFree)(lVar6);
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlUTF8Strsub",(ulong)(uint)(iVar4 - iVar3));
            local_48 = local_48 + 1;
            printf(" %d",(ulong)uVar15);
            printf(" %d",uVar11);
            printf(" %d");
            putchar(10);
            in_RSI = piVar12;
          }
        }
        piVar12 = (int *)(ulong)(iVar2 + 1);
      }
      uVar11 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_48 = local_88 + local_8c + test_ret_4 + local_78 + test_ret_5 + local_7c +
             local_40 + local_74 + test_ret_3 + local_44 + local_68 +
             local_80 + test_ret_2 + local_38 + local_3c +
             local_58 + local_5c + local_60 + local_34 + local_54 + local_4c + test_ret_1 + local_48
  ;
  uVar15 = -(test_ret - local_48);
  if (test_ret != local_48) {
    printf("Module xmlstring: %d errors\n",(ulong)uVar15);
  }
  return uVar15;
}

Assistant:

static int
test_xmlstring(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlstring : 26 of 30 functions ...\n");
    test_ret += test_xmlCharStrdup();
    test_ret += test_xmlCharStrndup();
    test_ret += test_xmlCheckUTF8();
    test_ret += test_xmlGetUTF8Char();
    test_ret += test_xmlStrEqual();
    test_ret += test_xmlStrPrintf();
    test_ret += test_xmlStrQEqual();
    test_ret += test_xmlStrVPrintf();
    test_ret += test_xmlStrcasecmp();
    test_ret += test_xmlStrcasestr();
    test_ret += test_xmlStrchr();
    test_ret += test_xmlStrcmp();
    test_ret += test_xmlStrdup();
    test_ret += test_xmlStrlen();
    test_ret += test_xmlStrncasecmp();
    test_ret += test_xmlStrncatNew();
    test_ret += test_xmlStrncmp();
    test_ret += test_xmlStrndup();
    test_ret += test_xmlStrstr();
    test_ret += test_xmlStrsub();
    test_ret += test_xmlUTF8Charcmp();
    test_ret += test_xmlUTF8Size();
    test_ret += test_xmlUTF8Strlen();
    test_ret += test_xmlUTF8Strloc();
    test_ret += test_xmlUTF8Strndup();
    test_ret += test_xmlUTF8Strpos();
    test_ret += test_xmlUTF8Strsize();
    test_ret += test_xmlUTF8Strsub();

    if (test_ret != 0)
	printf("Module xmlstring: %d errors\n", test_ret);
    return(test_ret);
}